

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CHog.h
# Opt level: O2

void __thiscall CHog::getFeatVect(CHog *this,double *featVect,int x,int y,int w,int h)

{
  int iVar1;
  int iVar2;
  long lVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  ulong uVar8;
  int j;
  int iVar9;
  int iVar10;
  double *local_50;
  
  iVar10 = x + 1;
  iVar2 = y + 1;
  local_50 = featVect;
  if (featVect == (double *)0x0) {
    lVar3 = (long)(h * w) * (long)this->hist[iVar2][iVar10].dim;
    uVar8 = 0xffffffffffffffff;
    if (-1 < (int)lVar3) {
      uVar8 = lVar3 * 8;
    }
    local_50 = (double *)operator_new__(uVar8);
  }
  iVar6 = 0;
  iVar7 = 0;
  if (0 < w) {
    iVar7 = w;
  }
  if (h < 1) {
    h = 0;
  }
  for (iVar5 = 0; iVar5 != h; iVar5 = iVar5 + 1) {
    iVar4 = (this->histSizeY - y) + -2;
    if (iVar5 + iVar2 < this->histSizeY) {
      iVar4 = iVar5;
    }
    for (iVar9 = 0; iVar7 != iVar9; iVar9 = iVar9 + 1) {
      iVar1 = (this->histSizeX - x) + -2;
      if (iVar10 + iVar9 < this->histSizeX) {
        iVar1 = iVar9;
      }
      lVar3 = (long)this->hist[iVar4 + iVar2][iVar1 + iVar10].dim;
      memcpy(local_50 + (iVar6 + iVar9) * lVar3,this->hist[iVar4 + iVar2][iVar1 + iVar10].feat,
             lVar3 << 3);
    }
    iVar6 = iVar6 + w;
  }
  return;
}

Assistant:

void CHog::getFeatVect(double* featVect, int x, int y, int w, int h)
{
	//cout << "getting feature vector" << endl;
    x += 1;
    y += 1;
    int dx, dy;
    if(featVect==NULL)
        featVect = new double[w*h*hist[y][x].dim];
    for(int i=0; i<h; i++)
    {
        if(y+i>=histSizeY)
            dy = histSizeY-y-1;
        else
            dy = i;
        for(int j=0; j<w; j++)
        {
            if(x+j>=histSizeX)
                dx = histSizeX-x-1;
            else
                dx = j;
            memcpy(featVect+(i*w+j)*hist[y+dy][x+dx].dim, hist[y+dy][x+dx].feat, sizeof(double)*hist[y+dy][x+dx].dim);
        }
    }
	//cout << "feature vector got" << endl;
}